

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O1

void __thiscall SSD1306::OledBitmap<128,_64>::setPixel(OledBitmap<128,_64> *this,OledPoint p)

{
  uchar *puVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  
  bVar3 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar3) {
    iVar2 = p.m_x;
    iVar4 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    puVar1 = (this->blocks_)._M_elems[(long)p >> 0x20]._M_elems + (iVar4 >> 3);
    *puVar1 = *puVar1 | (byte)(1 << (7 - ((char)p.m_x - ((byte)iVar4 & 0xf8)) & 0x1f));
  }
  return;
}

Assistant:

void
    setPixel(
        SSD1306::OledPoint p) override
    {
        if (not pixelInside(p))
        {
            return;
        }

        PixelOffset offset{p};

        blocks_[offset.block][offset.byte] |= (1 << offset.bit);
    }